

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O1

bool __thiscall ExternalTester::testAllWavelet(ExternalTester *this)

{
  TwoOneExpNX2 *f;
  _Rb_tree_header *p_Var1;
  int iVar2;
  bool bVar3;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>
  __it;
  long lVar4;
  undefined8 *puVar5;
  ostream *poVar6;
  int i_2;
  int *piVar7;
  int i_1;
  int i;
  long lVar8;
  size_type __n;
  long lVar9;
  int j;
  int iVar10;
  long lVar11;
  int i_3;
  value_type_conflict1 *__val;
  double dVar12;
  vector<double,_std::allocator<double>_> v;
  vector<int,_std::allocator<int>_> indx;
  vector<int,_std::allocator<int>_> pntr;
  vector<double,_std::allocator<double>_> vals;
  vector<double,_std::allocator<double>_> pnts;
  TasmanianSparseGrid grid;
  vector<double,_std::allocator<double>_> local_168;
  long *local_148;
  long lStack_140;
  long local_138 [2];
  void **local_128;
  undefined8 uStack_120;
  long local_118;
  void *local_108;
  undefined8 uStack_100;
  long local_f8;
  vector<double,_std::allocator<double>_> local_f0;
  vector<double,_std::allocator<double>_> local_d8;
  ExternalTester *local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
  local_b0 [2];
  
  f = &this->f21nx2;
  bVar3 = testLocalWaveletRule
                    (this,&f->super_BaseFunction,(int *)&DAT_00134850,(double *)&DAT_00134880,true);
  if (bVar3) {
    bVar3 = testLocalWaveletRule
                      (this,&f->super_BaseFunction,(int *)&DAT_00134850,(double *)&DAT_00134880,
                       false);
    if (bVar3) {
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
           0xb;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Rules",5);
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
           0x22;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"wavelet",7);
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
           0xf;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Pass",4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      bVar3 = true;
      goto LAB_0011787a;
    }
  }
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0xb;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Rule",4);
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x22;
  local_108 = (void *)CONCAT44(local_108._4_4_,0x29);
  TasGrid::IO::getStringRuleMap_abi_cxx11_();
  p_Var1 = &local_b0[0]._M_impl.super__Rb_tree_header;
  __it._M_node = local_b0[0]._M_impl.super__Rb_tree_header._M_header._M_left;
  local_128 = &local_108;
  if ((_Rb_tree_header *)local_b0[0]._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::{lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)#1}>
              ::operator()((_Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::_lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)_1_>
                            *)&local_128,__it);
      if (bVar3) break;
      __it._M_node = (_Base_ptr)std::_Rb_tree_increment(__it._M_node);
    } while ((_Rb_tree_header *)__it._M_node != p_Var1);
  }
  local_148 = local_138;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,*(long *)(__it._M_node + 1),
             (long)&(__it._M_node[1]._M_parent)->_M_color + *(long *)(__it._M_node + 1));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
  ::~_Rb_tree(local_b0);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_148,lStack_140);
  *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 0xf;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"FAIL",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (local_148 != local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  bVar3 = false;
LAB_0011787a:
  TasGrid::TasmanianSparseGrid::TasmanianSparseGrid((TasmanianSparseGrid *)local_b0);
  TasGrid::TasmanianSparseGrid::makeWaveletGrid
            ((int)(TasmanianSparseGrid *)local_b0,2,1,2,(int *)0x1);
  local_148 = (long *)0x0;
  lStack_140 = 0;
  local_138[0] = 0;
  local_118 = 0;
  local_128 = (void **)0x0;
  uStack_120 = 0;
  local_f8 = 0;
  local_108 = (void *)0x0;
  uStack_100 = 0;
  genRandom(&local_f0,10,2);
  TasGrid::TasmanianSparseGrid::evaluateSparseHierarchicalFunctions
            ((vector *)local_b0,(vector *)&local_f0,(vector *)&local_128,(vector *)&local_148);
  local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  getError(this,&f->super_BaseFunction,(TasmanianSparseGrid *)local_b0,type_internal_interpolation,
           &local_168);
  if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  lVar4 = TasGrid::TasmanianSparseGrid::getHierarchicalCoefficients();
  puVar5 = (undefined8 *)operator_new(0x50);
  puVar5[8] = 0;
  puVar5[9] = 0;
  puVar5[6] = 0;
  puVar5[7] = 0;
  puVar5[4] = 0;
  puVar5[5] = 0;
  puVar5[2] = 0;
  puVar5[3] = 0;
  *puVar5 = 0;
  puVar5[1] = 0;
  local_b8 = this;
  TasGrid::TasmanianSparseGrid::evaluateBatch
            ((double *)local_b0,
             (int)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,(double *)0xa);
  lVar8 = 0;
  do {
    iVar10 = *(int *)((long)local_128 + lVar8 * 4);
    lVar9 = (long)iVar10;
    iVar2 = *(int *)((long)local_128 + lVar8 * 4 + 4);
    if (iVar10 < iVar2) {
      dVar12 = (double)puVar5[lVar8];
      do {
        dVar12 = dVar12 - *(double *)(lVar4 + (long)*(int *)((long)local_148 + lVar9 * 4) * 8) *
                          *(double *)((long)local_108 + lVar9 * 8);
        puVar5[lVar8] = dVar12;
        lVar9 = lVar9 + 1;
      } while (iVar2 != lVar9);
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 10);
  lVar4 = 0;
  do {
    if (1e-12 < ABS((double)puVar5[lVar4])) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error in evaluateSparseHierarchicalFunctions() (wavelet)",
                 0x38);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      poVar6 = std::ostream::_M_insert<double>((double)puVar5[lVar4]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      bVar3 = false;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 10);
  if (local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
    __n = 0;
  }
  else {
    piVar7 = (int *)(local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x20);
    if (*(long *)(local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x28) ==
        *(long *)(local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x30)) {
      piVar7 = (int *)(local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x48);
    }
    __n = (size_type)(*piVar7 * 10);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_168,__n,(allocator_type *)&local_d8);
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  getError(local_b8,&f->super_BaseFunction,(TasmanianSparseGrid *)local_b0,
           type_internal_interpolation,&local_d8);
  if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  TasGrid::TasmanianSparseGrid::evaluateHierarchicalFunctions
            ((vector *)local_b0,(vector *)&local_f0);
  lVar4 = TasGrid::TasmanianSparseGrid::getHierarchicalCoefficients();
  TasGrid::TasmanianSparseGrid::evaluateBatch
            ((double *)local_b0,
             (int)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,(double *)0xa);
  lVar8 = 0;
  do {
    lVar9 = 0;
    while( true ) {
      if (local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
        lVar11 = 0;
      }
      else {
        piVar7 = (int *)(local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x48);
        if (*(long *)(local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x28) !=
            *(long *)(local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x30)) {
          piVar7 = (int *)(local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x20);
        }
        lVar11 = (long)*piVar7;
      }
      if (lVar11 <= lVar9) break;
      if (local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
        iVar10 = 0;
      }
      else {
        piVar7 = (int *)(local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x20);
        if (*(long *)(local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x28) ==
            *(long *)(local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x30)) {
          piVar7 = (int *)(local_b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x48);
        }
        iVar10 = *piVar7;
      }
      puVar5[lVar8] =
           (double)puVar5[lVar8] -
           *(double *)(lVar4 + lVar9 * 8) *
           local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[iVar10 * (int)lVar8 + lVar9];
      lVar9 = lVar9 + 1;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 10);
  lVar4 = 0;
  do {
    if (1e-12 < ABS((double)puVar5[lVar4])) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error in getHierarchicalCoefficients() (wavelet)",0x30);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      poVar6 = std::ostream::_M_insert<double>((double)puVar5[lVar4]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      bVar3 = false;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 10);
  if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  operator_delete(puVar5,0x50);
  if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_108 != (void *)0x0) {
    operator_delete(local_108,local_f8 - (long)local_108);
  }
  if (local_128 != (void **)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  if (local_148 != (long *)0x0) {
    operator_delete(local_148,local_138[0] - (long)local_148);
  }
  TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid((TasmanianSparseGrid *)local_b0);
  return bVar3;
}

Assistant:

bool ExternalTester::testAllWavelet() const{
    bool pass = true;
    // Depths and tolerances for quadrature (column 1), interpolation (columns 2-3), and differentiation (columns 4-5).
    const int depths1[10] = { 7, 7, 7, 7, 7, // order 1
                              5, 5, 5, 5, 5 }; // order 3
    const double tols1[10] = { 5.E-05, 1.E-04, 1.E-04, 5E-02, 5E-02, // order 1
                               1.E-08, 1.E-07, 1.E-07, 5E-05, 5E-05 }; // order 3
    int wfirst = 11, wsecond = 34, wthird = 15;
    if (testLocalWaveletRule(&f21nx2, depths1, tols1, true) and testLocalWaveletRule(&f21nx2, depths1, tols1, false)){
        cout << setw(wfirst) << "Rules" << setw(wsecond) << "wavelet" << setw(wthird) << "Pass" << endl;
    }else{
        cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(rule_wavelet) << setw(wthird) << "FAIL" << endl; pass = false;
    }{ TasGrid::TasmanianSparseGrid grid;
        grid.makeWaveletGrid(2, 1, 2, 1);
        std::vector<int> indx, pntr;
        std::vector<double> vals;
        std::vector<double> pnts = genRandom(10, 2);
        grid.evaluateSparseHierarchicalFunctions(pnts, pntr, indx, vals);
        getError(&f21nx2, grid, type_internal_interpolation); // this is done to load the values
        const double *coeff = grid.getHierarchicalCoefficients();
        std::vector<double> y(10);
        grid.evaluateBatch(pnts.data(), 10, y.data());
        for(int i=0; i<10; i++){
            for(int j=pntr[i]; j<pntr[i+1]; j++){
                y[i] -= coeff[indx[j]] * vals[j];
            }
        }
        for(int i=0; i<10; i++){
            if (std::abs(y[i]) > Maths::num_tol){
                cout << "Error in evaluateSparseHierarchicalFunctions() (wavelet)" << endl;
                cout << y[i] << endl;
                pass = false;
            }
        }
        std::vector<double> v(10 * grid.getNumPoints());
        getError(&f21nx2, grid, type_internal_interpolation);
        grid.evaluateHierarchicalFunctions(pnts, v);
        coeff = grid.getHierarchicalCoefficients();
        grid.evaluateBatch(pnts.data(), 10, y.data());
        for(int i=0; i<10; i++){
            for(int j=0; j<grid.getNumPoints(); j++){
                y[i] -= coeff[j] * v[i*grid.getNumPoints() + j];
            }
        }
        for(int i=0; i<10; i++){
            if (std::abs(y[i]) > Maths::num_tol){
                cout << "Error in getHierarchicalCoefficients() (wavelet)" << endl;
                cout << y[i] << endl;
                pass = false;
            }
        }
    }
    return pass;
}